

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bstr.c
# Opt level: O3

uint8_t * bstr_while_predicate(uint8_t *pBegin,uint8_t *pEnd,_func_int_int *pred_func)

{
  int iVar1;
  uint8_t *puVar2;
  
  do {
    puVar2 = pBegin;
    if (pEnd <= puVar2) {
      return puVar2;
    }
    iVar1 = (*pred_func)((int)*puVar2);
    pBegin = puVar2 + 1;
  } while (iVar1 != 0);
  return puVar2;
}

Assistant:

const uint8_t *bstr_while_predicate(const uint8_t *pBegin, const uint8_t *pEnd, int (*pred_func)(int c) )
{
   const uint8_t *pNext = pBegin;
   while (pNext < pEnd)
   {
      int c = (int) *pNext;
      if (!pred_func(c)){
         break;
      }
      pNext++;
   }
   return pNext;
}